

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O0

uint64_t hashmap_murmur(void *data,size_t len,uint64_t seed0,uint64_t seed1)

{
  uint64_t uVar1;
  uint64_t seed1_local;
  uint64_t seed0_local;
  size_t len_local;
  void *data_local;
  
  uVar1 = MM86128(data,(int)len,(uint32_t)seed0);
  return uVar1;
}

Assistant:

uint64_t hashmap_murmur(const void *data, size_t len, uint64_t seed0,
    uint64_t seed1)
{
    (void)seed1;
    return MM86128(data, len, seed0);
}